

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O2

void EBMOL::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                       MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                       MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                       MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *divu,
                       Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
                       DeviceVector<int> *iconserv,Geometry *geom,Real dt,bool is_velocity,
                       string redistribution_type)

{
  Box *pBVar1;
  EBCellFlagFab *pEVar2;
  string redistribution_type_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  bool bVar7;
  int k_2;
  FabType FVar8;
  uint uVar9;
  EBFArrayBoxFactory *this;
  FabArray<amrex::EBCellFlagFab> *pFVar10;
  MultiCutFab *pMVar11;
  FabArray<amrex::FArrayBox> *pFVar12;
  ulong uVar13;
  Array4<const_double> *pAVar14;
  Array4<const_double> *pAVar15;
  int *piVar16;
  pointer piVar17;
  int iVar18;
  int j_2;
  long lVar19;
  long lVar20;
  Array4<const_double> *pAVar21;
  ulong uVar22;
  long lVar23;
  undefined4 in_register_00000084;
  long lVar24;
  long lVar25;
  ulong uVar26;
  pointer piVar27;
  int k_5;
  long lVar28;
  int i;
  long lVar29;
  long lVar30;
  int j_6;
  long lVar31;
  int j;
  long lVar32;
  ulong uVar33;
  long lVar34;
  pointer piVar35;
  long lVar36;
  long lVar37;
  undefined1 auVar39 [16];
  int iVar41;
  undefined8 uVar38;
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar46;
  Periodicity PVar47;
  undefined8 in_stack_fffffffffffff618;
  undefined1 is_velocity_00;
  ulong in_stack_fffffffffffff620;
  Array4<const_double> *in_stack_fffffffffffff628;
  Box local_964;
  undefined8 local_948;
  long local_940;
  pointer local_938;
  FabArray<amrex::FArrayBox> *local_930;
  FabArray<amrex::FArrayBox> *local_928;
  ulong local_920;
  Array4<double> fx;
  Box result;
  int local_89c;
  int iStack_898;
  Array4<double> fz;
  Array4<double> fy;
  MFIter mfi;
  Array4<const_double> apy;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<const_double> fcy;
  Array4<const_double> q;
  Array4<double> advc_arr;
  Array4<const_double> local_5b0;
  Real local_570;
  FabArray<amrex::FArrayBox> *local_568;
  long local_560;
  long local_558;
  long local_550;
  long local_548;
  long local_540;
  long local_538;
  long local_530;
  long local_528;
  long local_520;
  long local_518;
  long local_510;
  long local_508;
  long local_500;
  long local_4f8;
  Box local_4ec;
  Box local_4d0;
  Box local_4b4;
  Array4<const_double> u;
  Array4<const_double> fcz;
  Array4<const_double> fcx_1;
  Array4<const_double> apz;
  Array4<const_double> local_390;
  MFItInfo local_34c;
  Array4<const_double> apx;
  Array4<const_double> w;
  Array4<const_double> v;
  Array4<const_double> ccc;
  string local_210 [32];
  Array4<const_double> vfrac;
  MultiFab advc;
  
  local_948 = CONCAT44(in_register_00000084,state_comp);
  local_938 = iconserv->m_data;
  local_928 = &aofs->super_FabArray<amrex::FArrayBox>;
  local_570 = dt;
  local_568 = &umac->super_FabArray<amrex::FArrayBox>;
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < ncomp + aofs_comp) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x30,(char *)0x0);
  }
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < (int)local_948 + ncomp)
  {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x31,(char *)0x0);
  }
  iVar18 = ncomp + edge_comp;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x32,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x33,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x34,(char *)0x0);
  }
  iVar18 = fluxes_comp + ncomp;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x35,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x36,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x37,(char *)0x0);
  }
  if ((((FabArray<amrex::FArrayBox> *)&local_928->super_FabArrayBase)->super_FabArrayBase).n_grow.
      vect[0] != 0) {
    amrex::Assert_host("aofs.nGrow() == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x38,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x39,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x3a,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x3b,(char *)0x0);
  }
  iVar18 = 0;
  if (!known_edgestate) {
    iVar18 = 2;
    if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 2) {
      amrex::Assert_host("state.nGrow() >= 2",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                         ,0x3f,(char *)0x0);
      iVar18 = 2;
    }
  }
  bVar7 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&state->super_FabArray<amrex::FArrayBox>);
  if (!bVar7) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x46,(char *)0x0);
  }
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                        &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi._12_12_ = SUB1612((undefined1  [16])0x0,4);
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  amrex::MultiFab::MultiFab
            (&advc,&(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,ncomp,3,
             (MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0);
  local_34c.num_streams = amrex::Gpu::Device::max_gpu_streams;
  local_34c.do_tiling = true;
  local_34c.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_34c.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_34c.tilesize.vect[2] = DAT_007d7ef0;
  local_34c.dynamic = true;
  local_34c.device_sync = true;
  local_930 = &state->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter(&mfi,&local_928->super_FabArrayBase,&local_34c);
  uVar13 = 0;
  if (0 < ncomp) {
    uVar13 = (ulong)(uint)ncomp;
  }
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_964,&mfi);
    amrex::MFIter::nodaltilebox(&local_4b4,&mfi,0);
    amrex::MFIter::nodaltilebox(&local_4d0,&mfi,1);
    amrex::MFIter::nodaltilebox(&local_4ec,&mfi,2);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&xed,&xedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&yed,&yedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&zed,&zedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    pFVar10 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    piVar16 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar16 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + mfi.currentIndex;
    }
    pEVar2 = (pFVar10->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar16];
    fcx_1.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
    fcx_1.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
    pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
    fcx_1.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    fcx_1.begin.x = (pBVar1->smallend).vect[0];
    fcx_1.begin.y = (pBVar1->smallend).vect[1];
    lVar20 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    lVar28 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
    lVar29 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    fcx_1.jstride = (lVar28 - (pBVar1->smallend).vect[0]) + 1;
    fcx_1.kstride =
         (lVar20 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
         fcx_1.jstride;
    fcx_1.nstride = (lVar29 - fcx_1.begin.z) * fcx_1.kstride;
    fcx_1.end._0_8_ = lVar28 + 1U & 0xffffffff | lVar20 << 0x20;
    fcx_1.end.z = (int)lVar29;
    FVar8 = amrex::EBCellFlagFab::getType(pEVar2,&local_964);
    if (FVar8 == covered) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&u,local_928,&mfi,aofs_comp);
      auVar4 = _DAT_006f8e90;
      auVar3 = _DAT_006f8e80;
      local_538 = (long)fx.begin.x;
      local_500 = (long)local_964.smallend.vect[2];
      local_540 = (long)fx.begin.y;
      lVar20 = (long)u.p +
               ((long)local_964.smallend.vect[1] - (long)u.begin.y) * u.jstride * 8 +
               (local_500 - u.begin.z) * u.kstride * 8 + (long)local_964.smallend.vect[0] * 8 +
               (long)u.begin.x * -8 + 8;
      uVar9 = local_964.bigend.vect[0] - local_964.smallend.vect[0];
      auVar39._4_4_ = 0;
      auVar39._0_4_ = uVar9;
      auVar39._8_4_ = uVar9;
      auVar39._12_4_ = 0;
      local_4f8 = u.nstride * 8;
      auVar39 = auVar39 ^ _DAT_006f8e90;
      local_548 = (long)fx.begin.z;
      local_550 = (long)xed.begin.x;
      local_558 = (long)xed.begin.y;
      local_560 = (long)xed.begin.z;
      local_508 = (long)fy.begin.x;
      local_510 = (long)fy.begin.y;
      local_518 = (long)fy.begin.z;
      local_520 = (long)yed.begin.x;
      local_528 = (long)yed.begin.y;
      local_530 = (long)yed.begin.z;
      uVar33 = 0;
      while (uVar26 = uVar33, lVar28 = local_500, lVar29 = lVar20, uVar26 != uVar13) {
        for (; lVar30 = (long)local_964.smallend.vect[1], lVar37 = lVar29,
            lVar28 <= local_964.bigend.vect[2]; lVar28 = lVar28 + 1) {
          for (; lVar30 <= local_964.bigend.vect[1]; lVar30 = lVar30 + 1) {
            if (local_964.smallend.vect[0] <= local_964.bigend.vect[0]) {
              uVar33 = 0;
              do {
                auVar42._8_4_ = (int)uVar33;
                auVar42._0_8_ = uVar33;
                auVar42._12_4_ = (int)(uVar33 >> 0x20);
                auVar43 = (auVar42 | auVar3) ^ auVar4;
                bVar7 = auVar39._0_4_ < auVar43._0_4_;
                iVar41 = auVar39._4_4_;
                iVar46 = auVar43._4_4_;
                if ((bool)(~(iVar41 < iVar46 || iVar46 == iVar41 && bVar7) & 1)) {
                  *(undefined8 *)(lVar37 + -8 + uVar33 * 8) = 0x483d6329f1c35ca5;
                }
                if (iVar41 >= iVar46 && (iVar46 != iVar41 || !bVar7)) {
                  *(undefined8 *)(lVar37 + uVar33 * 8) = 0x483d6329f1c35ca5;
                }
                uVar33 = uVar33 + 2;
              } while (((ulong)uVar9 + 2 & 0x1fffffffe) != uVar33);
            }
            lVar37 = lVar37 + u.jstride * 8;
          }
          lVar29 = lVar29 + u.kstride * 8;
        }
        lVar20 = lVar20 + local_4f8;
        local_920 = uVar26;
        uVar33 = uVar26 + 1;
      }
      lVar29 = (long)local_4b4.smallend.vect[1];
      lVar30 = (long)local_4b4.smallend.vect[2];
      lVar28 = (long)xed.p +
               (lVar29 - local_558) * xed.jstride * 8 + (lVar30 - local_560) * xed.kstride * 8 +
               (long)local_4b4.smallend.vect[0] * 8 + local_550 * -8;
      lVar37 = CONCAT44(fx.kstride._4_4_,(int)fx.kstride) * 8;
      lVar24 = CONCAT44(fx.jstride._4_4_,(int)fx.jstride) * 8;
      lVar20 = (long)fx.p +
               (lVar29 - local_540) * lVar24 + (lVar30 - local_548) * lVar37 +
               (long)local_4b4.smallend.vect[0] * 8 + local_538 * -8;
      for (uVar33 = 0; lVar32 = lVar30, lVar36 = lVar28, lVar31 = lVar20, uVar33 != uVar13;
          uVar33 = uVar33 + 1) {
        for (; lVar23 = lVar36, lVar25 = lVar29, lVar34 = lVar31, lVar32 <= local_4b4.bigend.vect[2]
            ; lVar32 = lVar32 + 1) {
          for (; lVar25 <= local_4b4.bigend.vect[1]; lVar25 = lVar25 + 1) {
            if (local_4b4.smallend.vect[0] <= local_4b4.bigend.vect[0]) {
              lVar19 = 0;
              do {
                *(undefined8 *)(lVar34 + lVar19 * 8) = 0;
                *(undefined8 *)(lVar23 + lVar19 * 8) = 0x483d6329f1c35ca5;
                lVar19 = lVar19 + 1;
              } while ((local_4b4.bigend.vect[0] - local_4b4.smallend.vect[0]) + 1 != (int)lVar19);
            }
            lVar23 = lVar23 + xed.jstride * 8;
            lVar34 = lVar34 + lVar24;
          }
          lVar36 = lVar36 + xed.kstride * 8;
          lVar31 = lVar31 + lVar37;
        }
        lVar28 = lVar28 + xed.nstride * 8;
        lVar20 = lVar20 + CONCAT44(fx.nstride._4_4_,(uint)fx.nstride) * 8;
      }
      lVar28 = (long)local_4d0.smallend.vect[1];
      lVar29 = (long)local_4d0.smallend.vect[2];
      lVar20 = (long)yed.p +
               (lVar28 - local_528) * yed.jstride * 8 + (lVar29 - local_530) * yed.kstride * 8 +
               (long)local_4d0.smallend.vect[0] * 8 + local_520 * -8;
      lVar30 = (long)fy.p +
               (lVar28 - local_510) * fy.jstride * 8 + (lVar29 - local_518) * fy.kstride * 8 +
               (long)local_4d0.smallend.vect[0] * 8 + local_508 * -8;
      local_940 = fy.nstride * 8;
      for (uVar33 = 0; lVar37 = lVar29, lVar24 = lVar20, lVar32 = lVar30, uVar33 != uVar13;
          uVar33 = uVar33 + 1) {
        for (; lVar36 = lVar28, lVar31 = lVar24, lVar23 = lVar32, lVar37 <= local_4d0.bigend.vect[2]
            ; lVar37 = lVar37 + 1) {
          for (; lVar36 <= local_4d0.bigend.vect[1]; lVar36 = lVar36 + 1) {
            if (local_4d0.smallend.vect[0] <= local_4d0.bigend.vect[0]) {
              lVar25 = 0;
              do {
                *(undefined8 *)(lVar23 + lVar25 * 8) = 0;
                *(undefined8 *)(lVar31 + lVar25 * 8) = 0x483d6329f1c35ca5;
                lVar25 = lVar25 + 1;
              } while ((local_4d0.bigend.vect[0] - local_4d0.smallend.vect[0]) + 1 != (int)lVar25);
            }
            lVar31 = lVar31 + yed.jstride * 8;
            lVar23 = lVar23 + fy.jstride * 8;
          }
          lVar24 = lVar24 + yed.kstride * 8;
          lVar32 = lVar32 + fy.kstride * 8;
        }
        lVar20 = lVar20 + yed.nstride * 8;
        lVar30 = lVar30 + local_940;
      }
      in_stack_fffffffffffff620 = (ulong)local_4ec.smallend.vect[1];
      lVar20 = (long)local_4ec.smallend.vect[2];
      in_stack_fffffffffffff628 = (Array4<const_double> *)(fz.kstride * 8);
      lVar29 = (in_stack_fffffffffffff620 - (long)zed.begin.y) * zed.jstride * 8 +
               (lVar20 - zed.begin.z) * zed.kstride * 8 + (long)local_4ec.smallend.vect[0] * 8 +
               (long)zed.begin.x * -8 + (long)zed.p;
      lVar28 = (in_stack_fffffffffffff620 - (long)fz.begin.y) * fz.jstride * 8 +
               (lVar20 - fz.begin.z) * (long)in_stack_fffffffffffff628 +
               (long)local_4ec.smallend.vect[0] * 8 + (long)fz.begin.x * -8 + (long)fz.p;
      for (uVar33 = 0; lVar30 = lVar29, lVar37 = lVar28, lVar24 = lVar20, uVar33 != uVar13;
          uVar33 = uVar33 + 1) {
        for (; uVar26 = in_stack_fffffffffffff620, lVar32 = lVar37, lVar36 = lVar30,
            lVar24 <= local_4ec.bigend.vect[2]; lVar24 = lVar24 + 1) {
          for (; (long)uVar26 <= (long)local_4ec.bigend.vect[1]; uVar26 = uVar26 + 1) {
            if (local_4ec.smallend.vect[0] <= local_4ec.bigend.vect[0]) {
              lVar31 = 0;
              do {
                *(undefined8 *)(lVar32 + lVar31 * 8) = 0;
                *(undefined8 *)(lVar36 + lVar31 * 8) = 0x483d6329f1c35ca5;
                lVar31 = lVar31 + 1;
              } while ((local_4ec.bigend.vect[0] - local_4ec.smallend.vect[0]) + 1 != (int)lVar31);
            }
            lVar36 = lVar36 + zed.jstride * 8;
            lVar32 = lVar32 + fz.jstride * 8;
          }
          lVar30 = lVar30 + zed.kstride * 8;
          lVar37 = (long)&in_stack_fffffffffffff628->p + lVar37;
        }
        lVar29 = lVar29 + zed.nstride * 8;
        lVar28 = lVar28 + fz.nstride * 8;
      }
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&u,local_568,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&v,&vmac->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&w,&wmac->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,&mfi);
      result.btype.itype = local_964.btype.itype;
      result.smallend.vect[0] = local_964.smallend.vect[0] - iVar18;
      result.smallend.vect[1] = local_964.smallend.vect[1] - iVar18;
      result.smallend.vect[2] = local_964.smallend.vect[2] - iVar18;
      result.bigend.vect[0] = local_964.bigend.vect[0] + iVar18;
      result.bigend.vect[1] = local_964.bigend.vect[1] + iVar18;
      result.bigend.vect[2] = local_964.bigend.vect[2] + iVar18;
      FVar8 = amrex::EBCellFlagFab::getType(pEVar2,&result);
      if (FVar8 == regular) {
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result,local_930,&mfi,(int)local_948);
          MOL::ComputeEdgeState
                    (&local_964,&xed,&yed,&zed,(Array4<const_double> *)&result,ncomp,&u,&v,&w,
                     &geom->domain,bcs,d_bcrec_ptr,is_velocity);
        }
        result.smallend.vect[0] = (int)xed.p;
        result.smallend.vect[1] = (int)((ulong)xed.p >> 0x20);
        result.smallend.vect[2] = (int)xed.jstride;
        result.bigend.vect[0] = (int)((ulong)xed.jstride >> 0x20);
        result.bigend.vect[1] = (int)xed.kstride;
        result.bigend.vect[2] = (int)((ulong)xed.kstride >> 0x20);
        result.btype.itype = (uint)xed.nstride;
        fcy.p = yed.p;
        fcy.jstride = yed.jstride;
        fcy.kstride = yed.kstride;
        fcy.nstride = yed.nstride;
        fcy.begin.z = yed.begin.z;
        fcy.end.z = yed.end.z;
        fcy.end.x = yed.end.x;
        fcy.end.y = yed.end.y;
        fcy.ncomp = yed.ncomp;
        fcz.p = zed.p;
        fcz.jstride = zed.jstride;
        fcz.kstride = zed.kstride;
        fcz.nstride = zed.nstride;
        fcz.begin.z = zed.begin.z;
        fcz.end.z = zed.end.z;
        fcz.end.x = zed.end.x;
        fcz.end.y = zed.end.y;
        fcz.ncomp = zed.ncomp;
        HydroUtils::ComputeFluxes
                  (&local_964,&fx,&fy,&fz,&u,&v,&w,(Array4<const_double> *)&result,&fcy,&fcz,geom,
                   ncomp,true);
        iVar6 = fx.begin.z;
        iVar5 = fx.begin.y;
        iVar46 = fx.begin.x;
        iVar41 = fx.nstride._4_4_;
        result.smallend.vect[0] = (int)fx.p;
        result.smallend.vect[1] = (int)((ulong)fx.p >> 0x20);
        result.smallend.vect[2] = (int)fx.jstride;
        result.bigend.vect[0] = fx.jstride._4_4_;
        result.bigend.vect[1] = (int)fx.kstride;
        result.bigend.vect[2] = fx.kstride._4_4_;
        result.btype.itype = (uint)fx.nstride;
        fcy.p = fy.p;
        fcy.jstride = fy.jstride;
        fcy.kstride = fy.kstride;
        fcy.nstride = fy.nstride;
        fcy.begin.z = fy.begin.z;
        fcy.begin.x = fy.begin.x;
        fcy.begin.y = fy.begin.y;
        fcy.end.z = fy.end.z;
        fcy.end.x = fy.end.x;
        fcy.end.y = fy.end.y;
        fcy.ncomp = fy.ncomp;
        fcz.p = fz.p;
        fcz.jstride = fz.jstride;
        fcz.kstride = fz.kstride;
        fcz.nstride = fz.nstride;
        fcz.begin.z = fz.begin.z;
        fcz.end.z = fz.end.z;
        fcz.end.x = fz.end.x;
        fcz.end.y = fz.end.y;
        fcz.ncomp = fz.ncomp;
        HydroUtils::ComputeDivergence
                  (&local_964,&advc_arr,(Array4<const_double> *)&result,&fcy,&fcz,ncomp,geom,-1.0,
                   true);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&result,local_930,&mfi,(int)local_948);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&fcy,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
        lVar28 = (long)local_964.smallend.vect[1];
        lVar20 = (long)local_964.smallend.vect[2];
        lVar30 = (long)local_964.smallend.vect[0];
        lVar29 = (lVar28 - advc_arr.begin.y) * advc_arr.jstride * 8 +
                 (lVar20 - advc_arr.begin.z) * advc_arr.kstride * 8 + lVar30 * 8 +
                 (long)advc_arr.begin.x * -8 + (long)advc_arr.p;
        local_920 = (lVar28 - fcy.begin.y) * fcy.jstride * 8 +
                    (lVar20 - fcy.begin.z) * fcy.kstride * 8 + lVar30 * 8 + (long)fcy.begin.x * -8 +
                    (long)fcy.p;
        pAVar21 = (Array4<const_double> *)
                  ((lVar28 - iVar5) * CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                   (lVar20 - iVar6) * CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                   lVar30 * 8 + (long)iVar46 * -8 +
                  CONCAT44(result.smallend.vect[1],result.smallend.vect[0]));
        local_940 = CONCAT44(iVar41,result.btype.itype) * 8;
        uVar33 = 0;
        in_stack_fffffffffffff620 = (long)iVar5;
        in_stack_fffffffffffff628 = (Array4<const_double> *)(long)iVar6;
        while (uVar26 = uVar33, pAVar14 = pAVar21, lVar30 = lVar20, lVar37 = lVar29,
              uVar33 = local_920, uVar26 != uVar13) {
          for (; pAVar15 = pAVar14, lVar24 = lVar28, lVar32 = lVar37, uVar22 = uVar33,
              lVar30 <= local_964.bigend.vect[2]; lVar30 = lVar30 + 1) {
            for (; lVar24 <= local_964.bigend.vect[1]; lVar24 = lVar24 + 1) {
              if (local_964.smallend.vect[0] <= local_964.bigend.vect[0]) {
                iVar46 = local_938[uVar26];
                lVar36 = 0;
                do {
                  if (iVar46 == 0) {
                    *(double *)(lVar32 + lVar36 * 8) =
                         (double)(&pAVar15->p)[lVar36] * *(double *)(uVar22 + lVar36 * 8) +
                         *(double *)(lVar32 + lVar36 * 8);
                  }
                  lVar36 = lVar36 + 1;
                } while ((local_964.bigend.vect[0] - local_964.smallend.vect[0]) + 1 != (int)lVar36)
                ;
              }
              lVar32 = lVar32 + advc_arr.jstride * 8;
              uVar22 = uVar22 + fcy.jstride * 8;
              pAVar15 = (Array4<const_double> *)
                        (&pAVar15->p + CONCAT44(result.bigend.vect[0],result.smallend.vect[2]));
            }
            pAVar14 = (Array4<const_double> *)
                      (&pAVar14->p + CONCAT44(result.bigend.vect[2],result.bigend.vect[1]));
            lVar37 = lVar37 + advc_arr.kstride * 8;
            uVar33 = uVar33 + fcy.kstride * 8;
          }
          lVar29 = lVar29 + advc_arr.nstride * 8;
          pAVar21 = (Array4<const_double> *)(&pAVar21->p + CONCAT44(iVar41,result.btype.itype));
          in_stack_fffffffffffff620 = uVar26;
          in_stack_fffffffffffff628 = pAVar14;
          uVar33 = uVar26 + 1;
        }
      }
      else {
        is_velocity_00 = is_velocity;
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fcy,this);
        amrex::MultiCutFab::const_array((Array4<const_double> *)&result,(MultiCutFab *)fcy.p,&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fcz,this);
        amrex::MultiCutFab::const_array(&fcy,(MultiCutFab *)fcz.jstride,&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&apx,this);
        amrex::MultiCutFab::const_array(&fcz,(MultiCutFab *)apx.kstride,&mfi);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&apy,this);
        amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)CONCAT44(apy.p._4_4_,(int)apy.p),&mfi);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&apz,this);
        amrex::MultiCutFab::const_array
                  (&apy,(MultiCutFab *)CONCAT44(apz.jstride._4_4_,(int)apz.jstride),&mfi);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&ccc,this);
        amrex::MultiCutFab::const_array(&apz,(MultiCutFab *)ccc.kstride,&mfi);
        pMVar11 = amrex::EBFArrayBoxFactory::getCentroid(this);
        amrex::MultiCutFab::const_array(&ccc,pMVar11,&mfi);
        pFVar12 = &amrex::EBFArrayBoxFactory::getVolFrac(this)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&vfrac,pFVar12,&mfi);
        if (!known_edgestate) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&q,local_930,&mfi,(int)local_948);
          ComputeEdgeState(&local_964,&xed,&yed,&zed,&q,ncomp,&u,&v,&w,&geom->domain,bcs,d_bcrec_ptr
                           ,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,&vfrac,
                           (Array4<const_amrex::EBCellFlag> *)&fcx_1,(bool)is_velocity_00);
        }
        q.p = xed.p;
        q.jstride = xed.jstride;
        q.kstride = xed.kstride;
        q.nstride = xed.nstride;
        q.begin.z = xed.begin.z;
        q.end.z = xed.end.z;
        q.end.x = xed.end.x;
        q.end.y = xed.end.y;
        q.ncomp = xed.ncomp;
        local_5b0.p = yed.p;
        local_5b0.jstride = yed.jstride;
        local_5b0.kstride = yed.kstride;
        local_5b0.nstride = yed.nstride;
        local_5b0.begin.z = yed.begin.z;
        local_5b0.end.z = yed.end.z;
        local_5b0.end.x = yed.end.x;
        local_5b0.end.y = yed.end.y;
        local_5b0.ncomp = yed.ncomp;
        local_390.p = zed.p;
        local_390.jstride = zed.jstride;
        local_390.kstride = zed.kstride;
        local_390.nstride = zed.nstride;
        local_390.begin.z = zed.begin.z;
        local_390.end.z = zed.end.z;
        local_390.end.x = zed.end.x;
        local_390.end.y = zed.end.y;
        local_390.ncomp = zed.ncomp;
        HydroUtils::EB_ComputeFluxes
                  (&local_964,&fx,&fy,&fz,&u,&v,&w,&q,&local_5b0,&local_390,&apx,&apy,&apz,geom,
                   ncomp,(Array4<const_amrex::EBCellFlag> *)&fcx_1,true);
        q.p = fx.p;
        q.jstride = CONCAT44(fx.jstride._4_4_,(int)fx.jstride);
        q.kstride = CONCAT44(fx.kstride._4_4_,(int)fx.kstride);
        q.nstride = CONCAT44(fx.nstride._4_4_,(uint)fx.nstride);
        q.begin.z = fx.begin.z;
        q.begin.x = fx.begin.x;
        q.begin.y = fx.begin.y;
        q.end.z = fx.end.z;
        q.ncomp = fx.ncomp;
        local_5b0.p = fy.p;
        local_5b0.jstride = fy.jstride;
        local_5b0.kstride = fy.kstride;
        local_5b0.nstride = fy.nstride;
        local_5b0.begin.z = fy.begin.z;
        local_5b0.begin.x = fy.begin.x;
        local_5b0.begin.y = fy.begin.y;
        local_5b0.end.z = fy.end.z;
        local_5b0.end.x = fy.end.x;
        local_5b0.end.y = fy.end.y;
        local_5b0.ncomp = fy.ncomp;
        local_390.p = fz.p;
        local_390.jstride = fz.jstride;
        local_390.kstride = fz.kstride;
        local_390.nstride = fz.nstride;
        local_390.begin.z = fz.begin.z;
        local_390.end.z = fz.end.z;
        local_390.end.x = fz.end.x;
        local_390.end.y = fz.end.y;
        local_390.ncomp = fz.ncomp;
        HydroUtils::EB_ComputeDivergence
                  (&local_964,&advc_arr,&q,&local_5b0,&local_390,&vfrac,ncomp,geom,-1.0,true);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&q,local_930,&mfi,(int)local_948);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_5b0,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
        lVar28 = (long)local_964.smallend.vect[1];
        lVar20 = (long)local_964.smallend.vect[2];
        lVar30 = (long)local_964.smallend.vect[0];
        lVar29 = (lVar28 - advc_arr.begin.y) * advc_arr.jstride * 8 +
                 (lVar20 - advc_arr.begin.z) * advc_arr.kstride * 8 + lVar30 * 8 +
                 (long)advc_arr.begin.x * -8 + (long)advc_arr.p;
        local_920 = (lVar28 - local_5b0.begin.y) * local_5b0.jstride * 8 +
                    (lVar20 - local_5b0.begin.z) * local_5b0.kstride * 8 + lVar30 * 8 +
                    (long)local_5b0.begin.x * -8 + (long)local_5b0.p;
        pAVar21 = (Array4<const_double> *)
                  ((lVar28 - q.begin.y) * q.jstride * 8 + (lVar20 - q.begin.z) * q.kstride * 8 +
                   lVar30 * 8 + (long)q.begin.x * -8 + (long)q.p);
        local_940 = q.nstride * 8;
        uVar33 = 0;
        in_stack_fffffffffffff620 = (long)q.begin.y;
        in_stack_fffffffffffff628 = (Array4<const_double> *)(long)q.begin.z;
        while (uVar26 = uVar33, pAVar14 = pAVar21, lVar30 = lVar20, uVar33 = local_920,
              lVar37 = lVar29, uVar26 != uVar13) {
          for (; pAVar15 = pAVar14, uVar22 = uVar33, lVar24 = lVar37, lVar32 = lVar28,
              lVar30 <= local_964.bigend.vect[2]; lVar30 = lVar30 + 1) {
            for (; lVar32 <= local_964.bigend.vect[1]; lVar32 = lVar32 + 1) {
              if (local_964.smallend.vect[0] <= local_964.bigend.vect[0]) {
                iVar41 = local_938[uVar26];
                lVar36 = 0;
                do {
                  if (iVar41 == 0) {
                    *(double *)(lVar24 + lVar36 * 8) =
                         (double)(&pAVar15->p)[lVar36] * *(double *)(uVar22 + lVar36 * 8) +
                         *(double *)(lVar24 + lVar36 * 8);
                  }
                  lVar36 = lVar36 + 1;
                } while ((local_964.bigend.vect[0] - local_964.smallend.vect[0]) + 1 != (int)lVar36)
                ;
              }
              lVar24 = lVar24 + advc_arr.jstride * 8;
              uVar22 = uVar22 + local_5b0.jstride * 8;
              pAVar15 = (Array4<const_double> *)(&pAVar15->p + q.jstride);
            }
            pAVar14 = (Array4<const_double> *)(&pAVar14->p + q.kstride);
            uVar33 = uVar33 + local_5b0.kstride * 8;
            lVar37 = lVar37 + advc_arr.kstride * 8;
          }
          lVar29 = lVar29 + advc_arr.nstride * 8;
          pAVar21 = (Array4<const_double> *)(&pAVar21->p + q.nstride);
          in_stack_fffffffffffff620 = uVar26;
          in_stack_fffffffffffff628 = pAVar14;
          uVar33 = uVar26 + 1;
        }
      }
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  PVar47 = amrex::Geometry::periodicity(geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar47.period.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar47.period.vect._1_7_;
  mfi.fabArray._0_4_ = PVar47.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  local_34c.do_tiling = true;
  local_34c.tilesize.vect[2] = DAT_007d7ef0;
  local_34c.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  local_34c.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  local_34c.dynamic = true;
  amrex::MFIter::MFIter(&mfi,&local_928->super_FabArrayBase,&local_34c);
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      amrex::MFIter::~MFIter(&mfi);
      amrex::MultiFab::~MultiFab(&advc);
      return;
    }
    amrex::MFIter::tilebox((Box *)&apy,&mfi);
    pFVar10 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    piVar16 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar16 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + mfi.currentIndex;
    }
    pEVar2 = (pFVar10->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar16];
    fy.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
    fy.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
    pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
    fy.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    fy.begin.x = (pBVar1->smallend).vect[0];
    fy.begin.y = (pBVar1->smallend).vect[1];
    lVar20 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    lVar28 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
    lVar29 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    fy.jstride = (lVar28 - (pBVar1->smallend).vect[0]) + 1;
    fy.kstride = (lVar20 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                 fy.jstride;
    fy.nstride = (lVar29 - fy.begin.z) * fy.kstride;
    fy.end._0_8_ = lVar28 + 1U & 0xffffffff | lVar20 << 0x20;
    fy.end.z = (int)lVar29;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&fz,local_928,&mfi,aofs_comp);
    FVar8 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&apy);
    if (FVar8 != covered) {
      fx.nstride._0_4_ = (uint)apy.nstride;
      fx.jstride._0_4_ = (int)apy.jstride + -4;
      fx.jstride._4_4_ = apy.jstride._4_4_ + 4;
      fx.p = (double *)CONCAT44(apy.p._4_4_ + -4,(int)apy.p + -4);
      fx.kstride._0_4_ = (int)apy.kstride + 4;
      fx.kstride._4_4_ = apy.kstride._4_4_ + 4;
      FVar8 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&fx);
      if (FVar8 == regular) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&fx,&advc.super_FabArray<amrex::FArrayBox>,&mfi);
        auVar3 = _DAT_006f1af0;
        local_938 = (pointer)(long)apy.p._4_4_;
        lVar20 = (long)(int)apy.jstride;
        in_stack_fffffffffffff620 = fz.kstride * 8;
        lVar30 = CONCAT44(fx.kstride._4_4_,(int)fx.kstride) * 8;
        lVar29 = CONCAT44(fx.jstride._4_4_,(int)fx.jstride) * 8;
        lVar28 = ((long)local_938 - (long)fx.begin.y) * lVar29 + (lVar20 - fx.begin.z) * lVar30 +
                 (long)(int)apy.p * 8 + (long)fx.begin.x * -8 + (long)fx.p;
        pAVar21 = (Array4<const_double> *)
                  (((long)local_938 - (long)fz.begin.y) * fz.jstride * 8 +
                   (lVar20 - fz.begin.z) * in_stack_fffffffffffff620 + (long)(int)apy.p * 8 +
                   (long)fz.begin.x * -8 + (long)fz.p);
        for (uVar33 = 0; pAVar14 = pAVar21, pAVar21 = pAVar14, lVar37 = lVar28, lVar24 = lVar20,
            uVar33 != uVar13; uVar33 = uVar33 + 1) {
          for (; piVar27 = local_938, lVar32 = lVar37, pAVar15 = pAVar21,
              lVar24 <= apy.kstride._4_4_; lVar24 = lVar24 + 1) {
            for (; (long)piVar27 <= (long)(int)apy.kstride; piVar27 = (pointer)((long)piVar27 + 1))
            {
              if ((int)apy.p <= apy.jstride._4_4_) {
                lVar36 = 0;
                do {
                  (&pAVar15->p)[lVar36] = (double *)(*(ulong *)(lVar32 + lVar36 * 8) ^ auVar3._0_8_)
                  ;
                  lVar36 = lVar36 + 1;
                } while ((apy.jstride._4_4_ - (int)apy.p) + 1 != (int)lVar36);
              }
              pAVar15 = (Array4<const_double> *)(&pAVar15->p + fz.jstride);
              lVar32 = lVar32 + lVar29;
            }
            pAVar21 = (Array4<const_double> *)(&pAVar21->p + fz.kstride);
            lVar37 = lVar37 + lVar30;
          }
          lVar28 = lVar28 + CONCAT44(fx.nstride._4_4_,(uint)fx.nstride) * 8;
          pAVar21 = (Array4<const_double> *)(&pAVar14->p + fz.nstride);
          in_stack_fffffffffffff628 = pAVar14;
        }
      }
      else {
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&fx,this);
        amrex::MultiCutFab::const_array((Array4<const_double> *)&xed,(MultiCutFab *)fx.p,&mfi);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&fx,this);
        amrex::MultiCutFab::const_array
                  ((Array4<const_double> *)&yed,
                   (MultiCutFab *)CONCAT44(fx.jstride._4_4_,(int)fx.jstride),&mfi);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&fx,this);
        amrex::MultiCutFab::const_array
                  ((Array4<const_double> *)&zed,
                   (MultiCutFab *)CONCAT44(fx.kstride._4_4_,(int)fx.kstride),&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fx,this);
        amrex::MultiCutFab::const_array(&fcx_1,(MultiCutFab *)fx.p,&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fx,this);
        amrex::MultiCutFab::const_array
                  (&u,(MultiCutFab *)CONCAT44(fx.jstride._4_4_,(int)fx.jstride),&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&fx,this);
        amrex::MultiCutFab::const_array
                  (&v,(MultiCutFab *)CONCAT44(fx.kstride._4_4_,(int)fx.kstride),&mfi);
        pMVar11 = amrex::EBFArrayBoxFactory::getCentroid(this);
        amrex::MultiCutFab::const_array(&w,pMVar11,&mfi);
        pFVar12 = &amrex::EBFArrayBoxFactory::getVolFrac(this)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&advc_arr,pFVar12,&mfi);
        apz.p = (double *)CONCAT44(apy.p._4_4_,(int)apy.p);
        apz.nstride._0_4_ = (uint)apy.nstride;
        apz.kstride._4_4_ = apy.kstride._4_4_;
        apz.kstride._0_4_ = (int)apy.kstride;
        apz.jstride._0_4_ = (int)apy.jstride;
        apz.jstride._4_4_ = apy.jstride._4_4_;
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )redistribution_type._M_dataplus._M_p,"StateRedist");
        if (bVar7) {
          iVar18 = (int)apz.p + -3;
          uVar38 = 0x3fffffffd;
LAB_0042980f:
          iVar41 = (int)((ulong)uVar38 >> 0x20);
          apz.jstride._0_4_ = (int)apz.jstride + (int)uVar38;
          apz.jstride._4_4_ = apz.jstride._4_4_ + iVar41;
          apz.kstride._0_4_ = (int)apz.kstride + iVar41;
          apz.p = (double *)CONCAT44(apz.p._4_4_ + (int)uVar38,iVar18);
          apz.kstride._4_4_ = apz.kstride._4_4_ + iVar41;
        }
        else {
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)redistribution_type._M_dataplus._M_p,"FluxRedist");
          if (bVar7) {
            iVar18 = (int)apz.p + -2;
            uVar38 = 0x2fffffffe;
            goto LAB_0042980f;
          }
        }
        amrex::FArrayBox::FArrayBox((FArrayBox *)&fx,(Box *)&apz,ncomp,true,false,(Arena *)0x0);
        amrex::BaseFab<double>::elixir<double,_0>((Elixir *)&ccc,(BaseFab<double> *)&fx);
        iVar41 = fx.begin.x;
        iVar18 = fx.nstride._4_4_;
        lVar20 = (long)fx.begin.z;
        lVar28 = (long)fx.end.x;
        result._8_8_ = ((long)fx.begin.y - (long)(int)(uint)fx.nstride) + 1;
        local_89c = fx.begin.y + 1;
        result.bigend.vect._4_8_ = ((lVar20 + 1) - (long)fx.nstride._4_4_) * result._8_8_;
        result.smallend.vect[0] = (int)fx.kstride;
        result.smallend.vect[1] = fx.kstride._4_4_;
        result.btype.itype = (uint)(((lVar28 + 1) - (long)fx.begin.x) * result.bigend.vect._4_8_);
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )redistribution_type._M_dataplus._M_p,"FluxRedist");
        auVar4 = _DAT_006f8e90;
        auVar3 = _DAT_006f8e80;
        if (bVar7) {
          iStack_898 = (int)(lVar20 + 1);
          uVar9 = ~(uint)fx.nstride + local_89c;
          auVar43._4_4_ = 0;
          auVar43._0_4_ = uVar9;
          auVar43._8_4_ = uVar9;
          auVar43._12_4_ = 0;
          lVar29 = CONCAT44(result.smallend.vect[1],result.smallend.vect[0]) + 8;
          auVar43 = auVar43 ^ _DAT_006f8e90;
          for (lVar20 = (long)iVar41; lVar30 = (long)iVar18, lVar37 = lVar29,
              lVar20 < (int)(lVar28 + 1); lVar20 = lVar20 + 1) {
            for (; lVar30 <= (long)iStack_898 + -1; lVar30 = lVar30 + 1) {
              if ((int)(uint)fx.nstride < local_89c) {
                uVar33 = 0;
                do {
                  auVar44._8_4_ = (int)uVar33;
                  auVar44._0_8_ = uVar33;
                  auVar44._12_4_ = (int)(uVar33 >> 0x20);
                  auVar44 = (auVar44 | auVar3) ^ auVar4;
                  bVar7 = auVar43._0_4_ < auVar44._0_4_;
                  iVar41 = auVar43._4_4_;
                  iVar46 = auVar44._4_4_;
                  if ((bool)(~(iVar41 < iVar46 || iVar46 == iVar41 && bVar7) & 1)) {
                    *(undefined8 *)(lVar37 + -8 + uVar33 * 8) = 0x3ff0000000000000;
                  }
                  if (iVar41 >= iVar46 && (iVar46 != iVar41 || !bVar7)) {
                    *(undefined8 *)(lVar37 + uVar33 * 8) = 0x3ff0000000000000;
                  }
                  uVar33 = uVar33 + 2;
                } while (((ulong)uVar9 + 2 & 0x1fffffffe) != uVar33);
              }
              lVar37 = lVar37 + result._8_8_ * 8;
            }
            lVar29 = lVar29 + result.bigend.vect._4_8_ * 8;
          }
        }
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&fcy,&advc.super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&fcz,local_930,&mfi,(int)local_948);
        std::__cxx11::string::string(local_210,(string *)redistribution_type._M_dataplus._M_p);
        apx.kstride = 0;
        apx.nstride = 0;
        apx.p = (double *)0x0;
        apx.jstride = 0;
        apx.begin.x = 1;
        apx.begin.y = 1;
        apx.begin.z = 1;
        apx.end.x = 0;
        apx.end.y = 0;
        apx.end.z = 0;
        apx.ncomp = 0;
        redistribution_type_00._M_string_length._0_1_ = 2;
        redistribution_type_00._M_dataplus._M_p = (pointer)local_210;
        redistribution_type_00._M_string_length._1_7_ = 0;
        redistribution_type_00.field_2._M_local_buf[0] = (char)&apx;
        redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)&apx >> 8);
        redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff618;
        Redistribution::Apply
                  ((Box *)&apy,ncomp,&fz,(Array4<double> *)&fcy,&fcz,(Array4<double> *)&result,
                   (Array4<const_amrex::EBCellFlag> *)&fy,(Array4<const_double> *)&xed,
                   (Array4<const_double> *)&yed,(Array4<const_double> *)&zed,
                   (Array4<const_double> *)&advc_arr,&fcx_1,&u,&v,&w,d_bcrec_ptr,geom,local_570,
                   redistribution_type_00,(int)in_stack_fffffffffffff620,0.5,
                   in_stack_fffffffffffff628);
        std::__cxx11::string::~string(local_210);
        auVar43 = _DAT_006f8e90;
        auVar4 = _DAT_006f8e80;
        auVar3 = _DAT_006f1af0;
        uVar9 = apy.jstride._4_4_ - (int)apy.p;
        auVar40._4_4_ = 0;
        auVar40._0_4_ = uVar9;
        auVar40._8_4_ = uVar9;
        auVar40._12_4_ = 0;
        in_stack_fffffffffffff628 = (Array4<const_double> *)(fz.nstride * 8);
        piVar27 = (pointer)((long)fz.p +
                           ((long)apy.p._4_4_ - (long)fz.begin.y) * fz.jstride * 8 +
                           ((long)(int)apy.jstride - (long)fz.begin.z) * fz.kstride * 8 +
                           (long)(int)apy.p * 8 + (long)fz.begin.x * -8 + 8);
        uVar33 = 0;
        while (uVar26 = uVar33, piVar17 = piVar27, piVar27 = piVar17,
              lVar20 = (long)(int)apy.jstride, uVar26 != uVar13) {
          for (; lVar28 = (long)apy.p._4_4_, piVar35 = piVar27, lVar20 <= apy.kstride._4_4_;
              lVar20 = lVar20 + 1) {
            for (; lVar28 <= (int)apy.kstride; lVar28 = lVar28 + 1) {
              if ((int)apy.p <= apy.jstride._4_4_) {
                uVar33 = 0;
                do {
                  auVar45._8_4_ = (int)uVar33;
                  auVar45._0_8_ = uVar33;
                  auVar45._12_4_ = (int)(uVar33 >> 0x20);
                  auVar39 = auVar40 ^ auVar43;
                  auVar44 = (auVar45 | auVar4) ^ auVar43;
                  bVar7 = auVar39._0_4_ < auVar44._0_4_;
                  iVar18 = auVar39._4_4_;
                  iVar41 = auVar44._4_4_;
                  if ((bool)(~(iVar18 < iVar41 || iVar41 == iVar18 && bVar7) & 1)) {
                    *(ulong *)(piVar35 + uVar33 * 2 + -2) =
                         *(ulong *)(piVar35 + uVar33 * 2 + -2) ^ auVar3._0_8_;
                  }
                  if (iVar18 >= iVar41 && (iVar41 != iVar18 || !bVar7)) {
                    *(ulong *)(piVar35 + uVar33 * 2) =
                         *(ulong *)(piVar35 + uVar33 * 2) ^ auVar3._0_8_;
                  }
                  uVar33 = uVar33 + 2;
                } while (((ulong)uVar9 + 2 & 0x1fffffffe) != uVar33);
              }
              piVar35 = piVar35 + fz.jstride * 2;
            }
            piVar27 = piVar27 + fz.kstride * 2;
          }
          piVar27 = (pointer)((long)&in_stack_fffffffffffff628->p + (long)piVar17);
          in_stack_fffffffffffff620 = uVar26;
          local_938 = piVar17;
          uVar33 = uVar26 + 1;
        }
        amrex::Gpu::Elixir::~Elixir((Elixir *)&ccc);
        amrex::BaseFab<double>::~BaseFab((BaseFab<double> *)&fx);
      }
    }
    amrex::MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
EBMOL::ComputeAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                     MultiFab const& state, int state_comp,
                     AMREX_D_DECL( MultiFab const& umac,
                                   MultiFab const& vmac,
                                   MultiFab const& wmac),
                     AMREX_D_DECL( MultiFab& xedge,
                                   MultiFab& yedge,
                                   MultiFab& zedge),
                     int  edge_comp,
                     bool known_edgestate,
                     AMREX_D_DECL( MultiFab& xfluxes,
                                   MultiFab& yfluxes,
                                   MultiFab& zfluxes),
                     int fluxes_comp,
                     MultiFab const& divu,
                     Vector<BCRec> const& bcs,
                     BCRec  const* d_bcrec_ptr,
                     Gpu::DeviceVector<int>& iconserv,
                     Geometry const&  geom,
                     const Real dt,
                     const bool is_velocity,
                     std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    int const* iconserv_ptr = iconserv.data();

    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_ALWAYS_ASSERT(aofs.nGrow() == 0);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););

    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    // If !known_edgestate, need 2 additional cells in state to compute
    //  the slopes needed to compute the edge state, since MOL uses slope
    //  order==2.
    int halo = known_edgestate ? 0 : 2;

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                          Array4<Real const> v = vmac.const_array(mfi);,
                          Array4<Real const> w = wmac.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

                    EBMOL::ComputeEdgeState( bx, AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag, is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx, AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(u,v,w),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted );

                //
                // Compute divergence
                //

        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz),
                                                 vfrac, ncomp, geom,
                                                 mult, fluxes_are_area_weighted );
                // Account for extra term needed for convective differencing
        // Don't forget we're mutliplying by -1.0 here...
                auto const& q = state.array(mfi, state_comp);
                auto const& divu_arr  = divu.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!iconserv_ptr[n])
                        advc_arr( i, j, k, n ) += q(i,j,k,n)*divu_arr(i,j,k);

                });
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
                    Array4<Real const> const q = state.const_array(mfi,state_comp);
                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);
                }

                // Compute fluxes
                HydroUtils::ComputeFluxes( bx,
                                           AMREX_D_DECL(fx,fy,fz),
                                           AMREX_D_DECL(u,v,w),
                                           AMREX_D_DECL(xed,yed,zed),
                                           geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );

                // Account for extra term needed for convective differencing
                auto const& q = state.array(mfi, state_comp);
                auto const& divu_arr  = divu.array(mfi);
                amrex::ParallelFor(bx, ncomp, [=]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!iconserv_ptr[n])
              advc_arr( i, j, k, n ) += q(i,j,k,n)*divu_arr(i,j,k);
                });
        }
        }
    }

    advc.FillBoundary(geom.periodicity());

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because we computed -div for all cases
        auto const& advc_arr = advc.array(mfi);
        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  - advc_arr(i,j,k,n); });
      }
    }
    }
}